

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O0

int main(int argc,char **argv)

{
  byte bVar1;
  ostream *poVar2;
  Statements *this;
  bool *pbVar3;
  undefined1 local_3d0 [8];
  SymTab symTab;
  Token lastToken;
  Statements *statements;
  Parser parser;
  Tokenizer tokenizer;
  ifstream local_220 [8];
  ifstream inputStream;
  char **argv_local;
  int argc_local;
  
  if (argc != 2) {
    poVar2 = std::operator<<((ostream *)&std::cout,"usage: ");
    poVar2 = std::operator<<(poVar2,*argv);
    std::operator<<(poVar2," nameOfAnInputFile\n");
    exit(1);
  }
  std::ifstream::ifstream(local_220);
  std::ifstream::open((char *)local_220,(_Ios_Openmode)argv[1]);
  bVar1 = std::ifstream::is_open();
  if ((bVar1 & 1) == 0) {
    poVar2 = std::operator<<((ostream *)&std::cout,"Unable top open ");
    poVar2 = std::operator<<(poVar2,argv[1]);
    std::operator<<(poVar2,". Terminating...");
    perror("Error when attempting to open the input file.");
    exit(2);
  }
  Tokenizer::Tokenizer((Tokenizer *)&parser,local_220);
  Parser::Parser((Parser *)&statements,(Tokenizer *)&parser);
  this = Parser::fileInput((Parser *)&statements);
  Tokenizer::getToken((Token *)&symTab.symTab._M_t._M_impl.super__Rb_tree_header._M_node_count,
                      (Tokenizer *)&parser);
  pbVar3 = Token::eof((Token *)&symTab.symTab._M_t._M_impl.super__Rb_tree_header._M_node_count);
  if ((*pbVar3 & 1U) == 0) {
    poVar2 = std::operator<<((ostream *)&std::cout,"Unexpected token in input.");
    std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
    Token::print((Token *)&symTab.symTab._M_t._M_impl.super__Rb_tree_header._M_node_count);
    exit(1);
  }
  SymTab::SymTab((SymTab *)local_3d0);
  std::operator<<((ostream *)&std::cout,"INPUT\n");
  std::operator<<((ostream *)&std::cout,"********\n");
  Statements::print(this);
  std::operator<<((ostream *)&std::cout,"OUTPUT\n");
  std::operator<<((ostream *)&std::cout,"********\n");
  Statements::evaluate(this,(SymTab *)local_3d0);
  poVar2 = (ostream *)
           std::ostream::operator<<((ostream *)&std::cout,std::endl<char,std::char_traits<char>>);
  std::operator<<(poVar2,"Symbol table contains the following variables.\n");
  SymTab::print((SymTab *)local_3d0);
  SymTab::~SymTab((SymTab *)local_3d0);
  Token::~Token((Token *)&symTab.symTab._M_t._M_impl.super__Rb_tree_header._M_node_count);
  Tokenizer::~Tokenizer((Tokenizer *)&parser);
  std::ifstream::~ifstream(local_220);
  return 0;
}

Assistant:

int main(int argc, char *argv[]) {
    if (argc != 2) {
        std::cout << "usage: " << argv[0] << " nameOfAnInputFile\n";
        exit(1);
    }
    std::ifstream inputStream;
    inputStream.open(argv[1], std::ios::in);
    if (!inputStream.is_open()) {
        std::cout << "Unable top open " << argv[1] << ". Terminating...";
        perror("Error when attempting to open the input file.");
        exit(2);
    }
    // Create tokens from Python file 
    Tokenizer tokenizer(inputStream); 

    // Parse tokens converting into matched Python statements
    Parser parser(tokenizer); 
    Statements *statements = parser.fileInput();

    Token lastToken = tokenizer.getToken();
    if (!lastToken.eof()) {
        std::cout << "Unexpected token in input." << std::endl;
        lastToken.print();
        exit(1);
    }
    // Use Symbol table to map variables and data types
    SymTab symTab;
    std::cout << "INPUT\n";
    std::cout << "********\n";
    statements->print();

    std::cout << "OUTPUT\n";
    std::cout << "********\n";

    // Evaluate and calculate Python statements and expressions
    statements->evaluate(symTab);
    std::cout << std::endl << "Symbol table contains the following variables.\n";
    symTab.print();

    return 0;
}